

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix4 * matrix4_make_transformation_rotationf_y(matrix4 *m,double angle)

{
  double dVar1;
  double dVar2;
  
  dVar1 = cos(angle);
  dVar2 = sin(angle);
  (m->field_0).m[1] = 0.0;
  (m->field_0).m[2] = 0.0;
  (m->field_0).m[3] = 0.0;
  (m->field_0).m[4] = 0.0;
  (m->field_0).m[5] = 1.0;
  (m->field_0).m[8] = 0.0;
  (m->field_0).m[9] = 0.0;
  (m->field_0).m[6] = 0.0;
  (m->field_0).m[7] = 0.0;
  (m->field_0).m[0xb] = 0.0;
  (m->field_0).m[0xc] = 0.0;
  (m->field_0).m[0xd] = 0.0;
  (m->field_0).m[0xe] = 0.0;
  (m->field_0).m[0xf] = 1.0;
  (m->field_0).m[0] = dVar1;
  (m->field_0).m[2] = -dVar2;
  (m->field_0).m[8] = dVar2;
  (m->field_0).m[10] = dVar1;
  return m;
}

Assistant:

HYPAPI struct matrix4 *matrix4_make_transformation_rotationf_y(struct matrix4 *m, HYP_FLOAT angle)
{
	HYP_FLOAT c = HYP_COS(angle);
	HYP_FLOAT s = HYP_SIN(angle);

	matrix4_identity(m);

	/* assuming col-major */
	m->r00 = c;
	m->r02 = -s;
	m->r20 = s;
	m->r22 = c;

	return m;
}